

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Bug3061120(void)

{
  bool bVar1;
  RE2 re;
  LogMessageFatal local_268;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,"(?i)\\W");
  local_268.super_LogMessage._0_8_ = "x";
  local_268.super_LogMessage._8_4_ = 1;
  bVar1 = RE2::PartialMatch<>((StringPiece *)&local_268,&local_e8);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c7);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: !(RE2::PartialMatch(\"x\", re))");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  local_268.super_LogMessage._0_8_ = "k";
  local_268.super_LogMessage._8_4_ = 1;
  bVar1 = RE2::PartialMatch<>((StringPiece *)&local_268,&local_e8);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c8);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: !(RE2::PartialMatch(\"k\", re))");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  local_268.super_LogMessage._0_8_ = "s";
  local_268.super_LogMessage._8_4_ = 1;
  bVar1 = RE2::PartialMatch<>((StringPiece *)&local_268,&local_e8);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c9);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: !(RE2::PartialMatch(\"s\", re))");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(RE2, Bug3061120) {
  RE2 re("(?i)\\W");
  EXPECT_FALSE(RE2::PartialMatch("x", re));  // always worked
  EXPECT_FALSE(RE2::PartialMatch("k", re));  // broke because of kelvin
  EXPECT_FALSE(RE2::PartialMatch("s", re));  // broke because of latin long s
}